

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int memdbFileSize(sqlite3_file *pFile,sqlite_int64 *pSize)

{
  sqlite3_io_methods *p_00;
  MemStore *p;
  sqlite_int64 *pSize_local;
  sqlite3_file *pFile_local;
  
  p_00 = pFile[1].pMethods;
  memdbEnter((MemStore *)p_00);
  *pSize = *(sqlite_int64 *)p_00;
  memdbLeave((MemStore *)p_00);
  return 0;
}

Assistant:

static int memdbFileSize(sqlite3_file *pFile, sqlite_int64 *pSize){
  MemStore *p = ((MemFile*)pFile)->pStore;
  memdbEnter(p);
  *pSize = p->sz;
  memdbLeave(p);
  return SQLITE_OK;
}